

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

Aig_Man_t * Fra_FraigChoice(Aig_Man_t *pManAig,int nConfMax,int nLevelMax)

{
  Aig_Man_t *pAVar1;
  Fra_Par_t *pPars;
  Fra_Par_t Pars;
  int nLevelMax_local;
  int nConfMax_local;
  Aig_Man_t *pManAig_local;
  
  Pars.fDontShowBar = nLevelMax;
  Pars._116_4_ = nConfMax;
  Fra_ParamsDefault((Fra_Par_t *)&pPars);
  Pars.fDoSparse = Pars._116_4_;
  Pars.dActConeBumpMax._0_4_ = 1;
  Pars.fProve = 1;
  Pars.dActConeBumpMax._4_4_ = 0;
  Pars.fChoicing = 0;
  Pars.fSpeculate = 0;
  Pars.fUse1Hot = 1;
  Pars.nBTLimitNode = Pars.fDontShowBar;
  pAVar1 = Fra_FraigPerform(pManAig,(Fra_Par_t *)&pPars);
  return pAVar1;
}

Assistant:

Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax )
{
    Fra_Par_t Pars, * pPars = &Pars; 
    Fra_ParamsDefault( pPars );
    pPars->nBTLimitNode = nConfMax;
    pPars->fChoicing    = 1;
    pPars->fDoSparse    = 1;
    pPars->fSpeculate   = 0;
    pPars->fProve       = 0;
    pPars->fVerbose     = 0;
    pPars->fDontShowBar = 1;
    pPars->nLevelMax    = nLevelMax;
    return Fra_FraigPerform( pManAig, pPars );
}